

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O3

bool anon_unknown.dwarf_1011334::InitializeSymbolTable
               (TString *builtIns,int version,EProfile profile,SpvVersion *spvVersion,
               EShLanguage language,EShSource source,TInfoSink *infoSink,TSymbolTable *symbolTable)

{
  SpvVersion spvVersion_00;
  string sourceEntryPointName;
  undefined4 uVar1;
  undefined4 uVar2;
  char cVar3;
  int iVar4;
  TParseContextBase *pc;
  char *builtInShaders [2];
  size_t builtInLengths [2];
  ForbidIncluder includer;
  TInputScanner input;
  TScanContext scanContext;
  TPpContext ppContext;
  TIntermediate intermediate;
  undefined8 in_stack_fffffffffffff2e8;
  uint uVar5;
  pointer local_ce8 [2];
  size_type local_cd8 [3];
  Includer local_cc0;
  long *local_cb8 [2];
  long local_ca8 [2];
  string local_c98;
  undefined4 local_c78;
  undefined8 local_c70;
  undefined8 *local_c68;
  undefined8 local_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined4 local_c48;
  undefined2 local_c40;
  TScanContext local_c38;
  TPpContext local_be8;
  TIntermediate local_818;
  
  glslang::TIntermediate::TIntermediate(&local_818,language,version,profile);
  uVar5 = spvVersion->spv;
  iVar4 = spvVersion->vulkanGlsl;
  uVar1 = spvVersion->vulkan;
  uVar2 = spvVersion->openGl;
  spvVersion_00.openGl = uVar2;
  spvVersion_00.vulkan = uVar1;
  local_cb8[0] = local_ca8;
  local_818.source = source;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cb8,"");
  spvVersion_00.vulkanGlsl = iVar4;
  spvVersion_00.spv = uVar5;
  spvVersion_00.vulkanRelaxed = spvVersion->vulkanRelaxed;
  spvVersion_00._17_3_ = *(undefined3 *)&spvVersion->field_0x11;
  sourceEntryPointName._M_string_length = in_stack_fffffffffffff2e8;
  sourceEntryPointName._M_dataplus._M_p = (pointer)local_cb8;
  sourceEntryPointName.field_2._M_allocated_capacity = (size_type)builtIns;
  sourceEntryPointName.field_2._8_4_ = uVar5;
  sourceEntryPointName.field_2._12_4_ = iVar4;
  pc = CreateParseContext(symbolTable,&local_818,version,profile,source,language,infoSink,
                          spvVersion_00,true,EShMsgDefault,true,sourceEntryPointName);
  if (local_cb8[0] != local_ca8) {
    operator_delete(local_cb8[0],local_ca8[0] + 1);
  }
  local_cc0._vptr_Includer = (_func_int **)&PTR_includeSystem_00af5960;
  local_c98._M_dataplus._M_p = (pointer)&local_c98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c98,"");
  glslang::TPpContext::TPpContext(&local_be8,pc,&local_c98,&local_cc0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c98._M_dataplus._M_p != &local_c98.field_2) {
    operator_delete(local_c98._M_dataplus._M_p,local_c98.field_2._M_allocated_capacity + 1);
  }
  local_c38._vptr_TScanContext = (_func_int **)&PTR__TScanContext_00af5db8;
  local_c38.afterType = false;
  local_c38.afterStruct = false;
  local_c38.field = false;
  local_c38.afterBuffer = false;
  pc->scanContext = &local_c38;
  pc->ppContext = &local_be8;
  local_c38.parseContext = pc;
  glslang::TSymbolTable::push(symbolTable);
  local_ce8[0] = (builtIns->_M_dataplus)._M_p;
  local_cd8[0] = builtIns->_M_string_length;
  if (local_cd8[0] == 0) {
    cVar3 = '\x01';
  }
  else {
    local_c98._M_dataplus._M_p = (pointer)&PTR__TInputScanner_00af5d98;
    local_c98._M_string_length._0_4_ = 1;
    local_c98.field_2._M_allocated_capacity = (size_type)local_ce8;
    local_c98.field_2._8_8_ = local_cd8;
    local_c78 = 0;
    local_c70 = 0;
    local_c60 = 0;
    local_c40 = 0;
    local_c68 = (undefined8 *)operator_new__(0x18);
    *local_c68 = 0;
    local_c68[1] = 0;
    *(undefined4 *)(local_c68 + 2) = 0;
    *(undefined4 *)((long)local_c68 + 0xc) = 1;
    local_c48 = 0;
    local_c58 = 0;
    uStack_c50 = 1;
    iVar4 = (*(pc->super_TParseVersions)._vptr_TParseVersions[0x3b])(pc,&local_be8,&local_c98,0);
    cVar3 = (char)iVar4;
    if (cVar3 == '\0') {
      glslang::TInfoSinkBase::message
                (&infoSink->info,EPrefixInternalError,"Unable to parse built-ins");
      printf("Unable to parse built-ins\n%s\n",(infoSink->info).sink._M_dataplus._M_p);
      puts(local_ce8[0]);
    }
    local_c98._M_dataplus._M_p = (pointer)&PTR__TInputScanner_00af5d98;
    if (local_c68 != (undefined8 *)0x0) {
      operator_delete__(local_c68);
    }
  }
  glslang::TPpContext::~TPpContext(&local_be8);
  (*(pc->super_TParseVersions)._vptr_TParseVersions[1])(pc);
  glslang::TIntermediate::~TIntermediate(&local_818);
  return (bool)cVar3;
}

Assistant:

bool InitializeSymbolTable(const TString& builtIns, int version, EProfile profile, const SpvVersion& spvVersion, EShLanguage language,
                           EShSource source, TInfoSink& infoSink, TSymbolTable& symbolTable)
{
    TIntermediate intermediate(language, version, profile);

    intermediate.setSource(source);

    std::unique_ptr<TParseContextBase> parseContext(CreateParseContext(symbolTable, intermediate, version, profile, source,
                                                                       language, infoSink, spvVersion, true, EShMsgDefault,
                                                                       true));

    TShader::ForbidIncluder includer;
    TPpContext ppContext(*parseContext, "", includer);
    TScanContext scanContext(*parseContext);
    parseContext->setScanContext(&scanContext);
    parseContext->setPpContext(&ppContext);

    //
    // Push the symbol table to give it an initial scope.  This
    // push should not have a corresponding pop, so that built-ins
    // are preserved, and the test for an empty table fails.
    //

    symbolTable.push();

    const char* builtInShaders[2];
    size_t builtInLengths[2];
    builtInShaders[0] = builtIns.c_str();
    builtInLengths[0] = builtIns.size();

    if (builtInLengths[0] == 0)
        return true;

    TInputScanner input(1, builtInShaders, builtInLengths);
    if (! parseContext->parseShaderStrings(ppContext, input) != 0) {
        infoSink.info.message(EPrefixInternalError, "Unable to parse built-ins");
        printf("Unable to parse built-ins\n%s\n", infoSink.info.c_str());
        printf("%s\n", builtInShaders[0]);

        return false;
    }

    return true;
}